

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O2

QByteArray * QSysInfo::bootUniqueId(void)

{
  long lVar1;
  int fd;
  qint64 qVar2;
  mode_t in_EDX;
  int in_ESI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char uuid [36];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fd = qt_safe_open("/proc/sys/kernel/random/boot_id",in_ESI,in_EDX);
  if (fd != -1) {
    uuid._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uuid._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uuid._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uuid._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    uuid[0x20] = -0x56;
    uuid[0x21] = -0x56;
    uuid[0x22] = -0x56;
    uuid[0x23] = -0x56;
    qVar2 = qt_safe_read(fd,uuid,0x24);
    qt_safe_close(fd);
    if (qVar2 == 0x24) {
      QByteArray::QByteArray(in_RDI,uuid,0x24);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return in_RDI;
      }
      goto LAB_00206b25;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (char *)0x0;
    (in_RDI->d).size = 0;
    return in_RDI;
  }
LAB_00206b25:
  __stack_chk_fail();
}

Assistant:

QByteArray QSysInfo::bootUniqueId()
{
#ifdef Q_OS_LINUX
    // use low-level API here for simplicity
    int fd = qt_safe_open("/proc/sys/kernel/random/boot_id", O_RDONLY);
    if (fd != -1) {
        char uuid[UuidStringLen];
        qint64 len = qt_safe_read(fd, uuid, sizeof(uuid));
        qt_safe_close(fd);
        if (len == UuidStringLen)
            return QByteArray(uuid, UuidStringLen);
    }
#elif defined(Q_OS_DARWIN)
    // "kern.bootsessionuuid" is only available by name
    char uuid[UuidStringLen + 1];
    size_t uuidlen = sizeof(uuid);
    if (sysctlbyname("kern.bootsessionuuid", uuid, &uuidlen, nullptr, 0) == 0
            && uuidlen == sizeof(uuid))
        return QByteArray(uuid, uuidlen - 1);
#endif
    return QByteArray();
}